

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddLine(ImDrawList *this,ImVec2 *p1,ImVec2 *p2,ImU32 col,float thickness)

{
  ImVec2 *lhs;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  float local_28;
  ImU32 local_24;
  float thickness_local;
  ImU32 col_local;
  ImVec2 *p2_local;
  ImVec2 *p1_local;
  ImDrawList *this_local;
  
  if ((col & 0xff000000) != 0) {
    local_28 = thickness;
    local_24 = col;
    _thickness_local = p2;
    p2_local = p1;
    p1_local = (ImVec2 *)this;
    ImVec2::ImVec2(&local_38,0.5,0.5);
    local_30 = operator+(p1,&local_38);
    PathLineTo(this,&local_30);
    lhs = _thickness_local;
    ImVec2::ImVec2(&local_48,0.5,0.5);
    local_40 = operator+(lhs,&local_48);
    PathLineTo(this,&local_40);
    PathStroke(this,local_24,false,local_28);
  }
  return;
}

Assistant:

void ImDrawList::AddLine(const ImVec2& p1, const ImVec2& p2, ImU32 col, float thickness)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;
    PathLineTo(p1 + ImVec2(0.5f, 0.5f));
    PathLineTo(p2 + ImVec2(0.5f, 0.5f));
    PathStroke(col, false, thickness);
}